

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  byte bVar4;
  BYTE BVar5;
  ushort uVar6;
  ulong uVar7;
  undefined8 uVar8;
  ushort uVar9;
  uint uVar10;
  BYTE *s;
  BYTE *__src;
  ushort *puVar11;
  ushort *__src_00;
  uint8_t *puVar12;
  ushort *puVar13;
  long lVar14;
  byte *pbVar15;
  BYTE *pBVar16;
  uint uVar17;
  BYTE *pBVar18;
  ulong uVar19;
  ushort *puVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  ushort *puVar23;
  ulong uVar24;
  BYTE *d;
  BYTE *d_1;
  BYTE *pBVar25;
  BYTE *pBVar26;
  ulong uVar27;
  int local_80;
  int local_70;
  
  uVar24 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar24 == 0) {
    uVar10 = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (uint8_t *)dest) {
      if (uVar24 < 0xffff) {
        uVar7 = LZ4_streamDecode->table[1];
        if (uVar7 != 0) {
          if (source == (char *)0x0) {
            return -1;
          }
          puVar12 = (LZ4_streamDecode->internal_donotuse).externalDict + uVar7;
          if ((LZ4_streamDecode->internal_donotuse).externalDict == (uint8_t *)0x0) {
            puVar12 = (uint8_t *)0x0;
          }
          if (maxOutputSize == 0) {
            if (compressedSize != 1) {
              return -1;
            }
            return -(uint)(*source != '\0');
          }
          if (compressedSize == 0) {
            return -1;
          }
          __src = (BYTE *)(dest + -uVar24);
          puVar1 = (ushort *)(source + compressedSize);
          pBVar3 = (BYTE *)(dest + maxOutputSize);
          __src_00 = (ushort *)source;
          pBVar26 = (BYTE *)dest;
          if (maxOutputSize < 0x40) goto LAB_0010b2f5;
          puVar20 = (ushort *)source;
LAB_0010acb1:
          __src_00 = (ushort *)((long)puVar20 + 1);
          bVar4 = (byte)*puVar20;
          uVar10 = (uint)bVar4;
          uVar24 = (ulong)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) {
            if ((ushort *)((long)puVar1 - 0xfU) <= __src_00) goto LAB_0010b33f;
            puVar23 = puVar20 + 1;
            uVar17 = 0;
            puVar20 = puVar20 + 8;
            do {
              puVar13 = puVar20;
              puVar11 = __src_00;
              __src_00 = (ushort *)((long)puVar11 + 1);
              uVar17 = uVar17 + *(byte *)((long)puVar13 + -0xf);
              puVar23 = (ushort *)((long)puVar23 + 1);
              puVar20 = (ushort *)((long)puVar13 + 1);
            } while (puVar13 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                     *(byte *)((long)puVar13 + -0xf) == 0xff);
            uVar24 = (ulong)uVar17 + 0xf;
            pBVar25 = pBVar26 + uVar24;
            if ((CARRY8((ulong)pBVar26,uVar24)) || ((ulong)-(long)puVar23 < uVar24)) {
              __src_00 = puVar13 + -7;
              goto LAB_0010b33f;
            }
            if (dest + (long)maxOutputSize + -0x20 < pBVar25) goto LAB_0010b151;
            puVar20 = (ushort *)((ulong)uVar17 + (long)puVar13 + 1);
            if (puVar1 + -0x10 < puVar20) {
              __src_00 = puVar13 + -7;
              goto LAB_0010b151;
            }
            lVar14 = 0;
            do {
              uVar8 = *(undefined8 *)((byte *)((long)__src_00 + lVar14) + 8);
              pBVar21 = pBVar26 + lVar14;
              *(undefined8 *)pBVar21 = *(undefined8 *)((long)__src_00 + lVar14);
              *(undefined8 *)(pBVar21 + 8) = uVar8;
              pbVar15 = (byte *)((long)puVar11 + lVar14 + 0x11);
              uVar8 = *(undefined8 *)(pbVar15 + 8);
              *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)pbVar15;
              *(undefined8 *)(pBVar21 + 0x18) = uVar8;
              lVar14 = lVar14 + 0x20;
            } while (pBVar21 + 0x20 < pBVar25);
          }
          else {
            pBVar25 = pBVar26 + uVar24;
            if ((ushort *)((long)puVar1 - 0x11U) < __src_00) goto LAB_0010b151;
            uVar8 = *(undefined8 *)((long)puVar20 + 9);
            *(undefined8 *)pBVar26 = *(undefined8 *)__src_00;
            *(undefined8 *)(pBVar26 + 8) = uVar8;
            puVar20 = (ushort *)(uVar24 + (long)__src_00);
          }
          uVar6 = *puVar20;
          uVar27 = (ulong)uVar6;
          __src_00 = puVar20 + 1;
          pBVar21 = pBVar25 + -uVar27;
          uVar24 = (ulong)(bVar4 & 0xf);
          if (uVar24 == 0xf) {
            if ((uVar7 < 0x10000) && (pBVar21 + uVar7 < __src)) goto LAB_0010b33f;
            uVar10 = 0;
            puVar20 = __src_00;
            do {
              __src_00 = (ushort *)((long)puVar20 + 1);
              if (puVar1 + -2 <= __src_00) goto LAB_0010b33f;
              uVar9 = *puVar20;
              uVar10 = uVar10 + (byte)uVar9;
              puVar20 = __src_00;
            } while ((byte)uVar9 == 0xff);
            uVar24 = (ulong)uVar10;
            if ((BYTE *)(-uVar24 - 0x10) < pBVar25) goto LAB_0010b33f;
            uVar19 = uVar24 + 0x13;
            if (pBVar3 + -0x40 <= pBVar25 + uVar24 + 0x13) goto LAB_0010b1d6;
          }
          else {
            uVar19 = uVar24 + 4;
            if (pBVar3 + -0x40 <= pBVar25 + uVar24 + 4) goto LAB_0010b1d6;
            if ((__src <= pBVar21) && (7 < uVar6)) {
              *(undefined8 *)pBVar25 = *(undefined8 *)pBVar21;
              *(undefined8 *)(pBVar25 + 8) = *(undefined8 *)(pBVar21 + 8);
              *(undefined2 *)(pBVar25 + 0x10) = *(undefined2 *)(pBVar21 + 0x10);
              puVar20 = __src_00;
              pBVar26 = pBVar25 + uVar24 + 4;
              goto LAB_0010acb1;
            }
          }
          if ((uVar7 < 0x10000) && (pBVar21 + uVar7 < __src)) goto LAB_0010b33f;
          pBVar2 = pBVar25 + uVar19;
          puVar20 = __src_00;
          pBVar26 = pBVar2;
          if (pBVar21 < __src) {
            if (pBVar3 + -5 < pBVar2) goto LAB_0010b33f;
            uVar27 = (long)__src - (long)pBVar21;
            uVar24 = uVar19 - uVar27;
            if (uVar19 < uVar27 || uVar24 == 0) {
              memmove(pBVar25,puVar12 + -uVar27,uVar19);
            }
            else {
              memcpy(pBVar25,puVar12 + -uVar27,uVar27);
              pBVar26 = pBVar25 + uVar27;
              if ((ulong)((long)pBVar26 - (long)__src) < uVar24) {
                pBVar25 = __src;
                if (uVar27 < uVar19) {
                  do {
                    *pBVar26 = *pBVar25;
                    pBVar26 = pBVar26 + 1;
                    pBVar25 = pBVar25 + 1;
                  } while (pBVar26 < pBVar2);
                }
              }
              else {
                memcpy(pBVar26,__src,uVar24);
                pBVar26 = pBVar2;
              }
            }
          }
          else if (uVar6 < 0x10) {
            LZ4_memcpy_using_offset(pBVar25,pBVar21,pBVar2,uVar27);
          }
          else {
            do {
              uVar8 = *(undefined8 *)(pBVar25 + -uVar27 + 8);
              *(undefined8 *)pBVar25 = *(undefined8 *)(pBVar25 + -uVar27);
              *(undefined8 *)(pBVar25 + 8) = uVar8;
              uVar8 = *(undefined8 *)(pBVar25 + -uVar27 + 0x10 + 8);
              *(undefined8 *)(pBVar25 + 0x10) = *(undefined8 *)(pBVar25 + -uVar27 + 0x10);
              *(undefined8 *)(pBVar25 + 0x18) = uVar8;
              pBVar25 = pBVar25 + 0x20;
            } while (pBVar25 < pBVar2);
          }
          goto LAB_0010acb1;
        }
        uVar10 = LZ4_decompress_safe_withSmallPrefix
                           (source,dest,compressedSize,maxOutputSize,uVar24);
      }
      else {
        uVar10 = LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
      }
      goto LAB_0010b34a;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar24;
    puVar12 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -uVar24;
    (LZ4_streamDecode->internal_donotuse).externalDict = puVar12;
    uVar10 = LZ4_decompress_safe_forceExtDict
                       (source,dest,compressedSize,maxOutputSize,puVar12,uVar24);
  }
  if ((int)uVar10 < 1) {
    return uVar10;
  }
  LZ4_streamDecode->table[3] = (ulong)uVar10;
  (LZ4_streamDecode->internal_donotuse).prefixEnd = (uint8_t *)(dest + uVar10);
  return uVar10;
LAB_0010b1d6:
  if ((uVar7 < 0x10000) && (pBVar21 + uVar7 < __src)) goto LAB_0010b33f;
  pBVar2 = pBVar25 + uVar19;
  pBVar26 = pBVar2;
  if (pBVar21 < __src) {
    if (pBVar3 + -5 < pBVar2) goto LAB_0010b33f;
    uVar27 = (long)__src - (long)pBVar21;
    uVar24 = uVar19 - uVar27;
    if (uVar19 < uVar27 || uVar24 == 0) {
      memmove(pBVar25,puVar12 + -uVar27,uVar19);
    }
    else {
      memcpy(pBVar25,puVar12 + -uVar27,uVar27);
      pBVar26 = pBVar25 + uVar27;
      if ((ulong)((long)pBVar26 - (long)__src) < uVar24) {
        pBVar25 = __src;
        if (uVar27 < uVar19) {
          do {
            *pBVar26 = *pBVar25;
            pBVar26 = pBVar26 + 1;
            pBVar25 = pBVar25 + 1;
          } while (pBVar26 < pBVar2);
        }
      }
      else {
        memcpy(pBVar26,__src,uVar24);
        pBVar26 = pBVar2;
      }
    }
  }
  else {
    if ((uint)uVar27 < 8) {
      pBVar25[0] = '\0';
      pBVar25[1] = '\0';
      pBVar25[2] = '\0';
      pBVar25[3] = '\0';
      *pBVar25 = *pBVar21;
      pBVar25[1] = pBVar21[1];
      pBVar25[2] = pBVar21[2];
      pBVar25[3] = pBVar21[3];
      uVar24 = (ulong)((uint)uVar27 << 2);
      uVar27 = (ulong)*(uint *)((long)inc32table + uVar24);
      *(undefined4 *)(pBVar25 + 4) = *(undefined4 *)(pBVar21 + uVar27);
      pBVar21 = pBVar21 + (uVar27 - (long)*(int *)((long)dec64table + uVar24));
    }
    else {
      *(undefined8 *)pBVar25 = *(undefined8 *)pBVar21;
      pBVar21 = pBVar21 + 8;
    }
    pBVar16 = pBVar25 + 8;
    if (pBVar3 + -0xc < pBVar2) {
      if (pBVar3 + -5 < pBVar2) goto LAB_0010b33f;
      pBVar25 = pBVar3 + -7;
      pBVar18 = pBVar21;
      pBVar22 = pBVar16;
      if (pBVar16 < pBVar25) {
        do {
          *(undefined8 *)pBVar22 = *(undefined8 *)pBVar18;
          pBVar22 = pBVar22 + 8;
          pBVar18 = pBVar18 + 8;
        } while (pBVar22 < pBVar25);
        pBVar21 = pBVar21 + ((long)pBVar25 - (long)pBVar16);
        pBVar16 = pBVar25;
      }
      for (; pBVar16 < pBVar2; pBVar16 = pBVar16 + 1) {
        BVar5 = *pBVar21;
        pBVar21 = pBVar21 + 1;
        *pBVar16 = BVar5;
      }
    }
    else {
      *(undefined8 *)pBVar16 = *(undefined8 *)pBVar21;
      if (0x10 < uVar19) {
        pBVar25 = pBVar25 + 0x10;
        do {
          pBVar21 = pBVar21 + 8;
          *(undefined8 *)pBVar25 = *(undefined8 *)pBVar21;
          pBVar25 = pBVar25 + 8;
        } while (pBVar25 < pBVar2);
      }
    }
  }
LAB_0010b2f5:
  bVar4 = (byte)*__src_00;
  __src_00 = (ushort *)((long)__src_00 + 1);
  while( true ) {
    uVar10 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar24 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= __src_00) ||
       (dest + (long)maxOutputSize + -0x20 < pBVar26)) goto LAB_0010b14d;
    uVar8 = *(undefined8 *)(__src_00 + 4);
    *(undefined8 *)pBVar26 = *(undefined8 *)__src_00;
    *(undefined8 *)(pBVar26 + 8) = uVar8;
    pBVar25 = pBVar26 + uVar24;
    uVar19 = (ulong)(uVar10 & 0xf);
    puVar20 = (ushort *)((long)__src_00 + uVar24);
    uVar27 = (ulong)*puVar20;
    pBVar21 = pBVar25 + -uVar27;
    if ((((uVar10 & 0xf) == 0xf) || (*puVar20 < 8)) || (pBVar21 < __src)) goto LAB_0010b195;
    *(undefined8 *)pBVar25 = *(undefined8 *)pBVar21;
    *(undefined8 *)(pBVar25 + 8) = *(undefined8 *)(pBVar21 + 8);
    *(undefined2 *)(pBVar25 + 0x10) = *(undefined2 *)(pBVar21 + 0x10);
    pBVar26 = pBVar25 + uVar19 + 4;
    bVar4 = *(byte *)((long)__src_00 + uVar24 + 2);
    __src_00 = (ushort *)((long)__src_00 + uVar24 + 3);
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src_00) goto LAB_0010b33f;
  pbVar15 = (byte *)((long)__src_00 + 1);
  uVar17 = 0;
  do {
    uVar6 = *__src_00;
    __src_00 = (ushort *)((long)__src_00 + 1);
    uVar17 = uVar17 + (byte)uVar6;
    pbVar15 = pbVar15 + 1;
  } while (__src_00 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar6 == 0xff);
  uVar24 = (ulong)uVar17 + 0xf;
  if ((CARRY8((ulong)pBVar26,uVar24)) || ((ulong)-(long)pbVar15 < uVar24)) goto LAB_0010b33f;
LAB_0010b14d:
  pBVar25 = pBVar26 + uVar24;
LAB_0010b151:
  puVar20 = (ushort *)((long)__src_00 + uVar24);
  if ((pBVar3 + -0xc < pBVar25) || (puVar1 + -4 < puVar20)) {
    if ((puVar20 != puVar1) || (pBVar3 < pBVar25)) goto LAB_0010b33f;
    memmove(pBVar26,__src_00,uVar24);
    local_80 = (int)dest;
    uVar10 = ((int)pBVar26 + (int)uVar24) - local_80;
    goto LAB_0010b34a;
  }
  do {
    *(undefined8 *)pBVar26 = *(undefined8 *)__src_00;
    pBVar26 = pBVar26 + 8;
    __src_00 = __src_00 + 4;
  } while (pBVar26 < pBVar25);
  uVar27 = (ulong)*puVar20;
  pBVar21 = pBVar25 + -uVar27;
  uVar19 = (ulong)(uVar10 & 0xf);
LAB_0010b195:
  __src_00 = puVar20 + 1;
  if ((int)uVar19 == 0xf) {
    uVar10 = 0;
    do {
      puVar20 = __src_00;
      __src_00 = (ushort *)((long)puVar20 + 1);
      if (puVar1 + -2 <= __src_00) goto LAB_0010b33c;
      uVar10 = uVar10 + (byte)*puVar20;
    } while ((byte)*puVar20 == 0xff);
    uVar19 = (ulong)uVar10 + 0xf;
    if (CARRY8((ulong)pBVar25,uVar19)) goto LAB_0010b33c;
  }
  uVar19 = uVar19 + 4;
  goto LAB_0010b1d6;
LAB_0010b33c:
  __src_00 = (ushort *)((long)puVar20 + 1);
LAB_0010b33f:
  local_70 = (int)source;
  uVar10 = ~(uint)__src_00 + local_70;
LAB_0010b34a:
  if (0 < (int)uVar10) {
    LZ4_streamDecode->table[3] = LZ4_streamDecode->table[3] + (ulong)uVar10;
    (LZ4_streamDecode->internal_donotuse).prefixEnd =
         (LZ4_streamDecode->internal_donotuse).prefixEnd + uVar10;
  }
  return uVar10;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;

    if (lz4sd->prefixSize == 0) {
        /* The first call, no dictionary yet. */
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd = (BYTE*)dest + result;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        /* They're rolling the current segment. */
        if (lz4sd->prefixSize >= 64 KB - 1)
            result = LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        else if (lz4sd->extDictSize == 0)
            result = LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize,
                                                         lz4sd->prefixSize);
        else
            result = LZ4_decompress_safe_doubleDict(source, dest, compressedSize, maxOutputSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)result;
        lz4sd->prefixEnd  += result;
    } else {
        /* The buffer wraps around, or they're switching to another buffer. */
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize,
                                                  lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}